

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSim.c
# Opt level: O0

Abc_Cex_t *
Gia_ManGenerateCounter(Gia_Man_t *pAig,int iFrame,int iOut,int nWords,int iPat,Vec_Int_t *vCis2Ids)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  Abc_Cex_t *pAVar4;
  uint *p_00;
  int local_4c;
  int Counter;
  int iPioId;
  int w;
  int i;
  int f;
  uint *pData;
  Abc_Cex_t *p;
  Vec_Int_t *vCis2Ids_local;
  int iPat_local;
  int nWords_local;
  int iOut_local;
  int iFrame_local;
  Gia_Man_t *pAig_local;
  
  iVar1 = Gia_ManRegNum(pAig);
  iVar2 = Gia_ManPiNum(pAig);
  pAVar4 = Abc_CexAlloc(iVar1,iVar2,iFrame + 1);
  pAVar4->iFrame = iFrame;
  pAVar4->iPo = iOut;
  local_4c = pAVar4->nRegs;
  p_00 = (uint *)malloc((long)nWords << 2);
  for (w = 0; w <= iFrame; w = w + 1) {
    for (iPioId = 0; iVar1 = Gia_ManPiNum(pAig), iPioId < iVar1; iPioId = iPioId + 1) {
      iVar1 = Vec_IntEntry(vCis2Ids,iPioId);
      if (iVar1 < pAVar4->nPis) {
        for (Counter = nWords + -1; -1 < Counter; Counter = Counter + -1) {
          uVar3 = Gia_ManRandom(0);
          p_00[Counter] = uVar3;
        }
        iVar2 = Abc_InfoHasBit(p_00,iPat);
        if (iVar2 != 0) {
          Abc_InfoSetBit((uint *)(pAVar4 + 1),local_4c + iVar1);
        }
      }
    }
    local_4c = pAVar4->nPis + local_4c;
  }
  if (p_00 != (uint *)0x0) {
    free(p_00);
  }
  return pAVar4;
}

Assistant:

Abc_Cex_t * Gia_ManGenerateCounter( Gia_Man_t * pAig, int iFrame, int iOut, int nWords, int iPat, Vec_Int_t * vCis2Ids )
{
    Abc_Cex_t * p;
    unsigned * pData;
    int f, i, w, iPioId, Counter;
    p = Abc_CexAlloc( Gia_ManRegNum(pAig), Gia_ManPiNum(pAig), iFrame+1 );
    p->iFrame = iFrame;
    p->iPo    = iOut;
    // fill in the binary data
    Counter = p->nRegs;
    pData = ABC_ALLOC( unsigned, nWords );
    for ( f = 0; f <= iFrame; f++, Counter += p->nPis )
    for ( i = 0; i < Gia_ManPiNum(pAig); i++ )
    {
        iPioId = Vec_IntEntry( vCis2Ids, i );
        if ( iPioId >= p->nPis )
            continue;
        for ( w = nWords-1; w >= 0; w-- )
            pData[w] = Gia_ManRandom( 0 );
        if ( Abc_InfoHasBit( pData, iPat ) )
            Abc_InfoSetBit( p->pData, Counter + iPioId );
    }
    ABC_FREE( pData );
    return p;
}